

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O3

CTInfo lj_ctype_info(CTState *cts,CTypeID id,CTSize *szp)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  CTSize CVar5;
  uint uVar6;
  
  uVar4 = (ulong)id;
  uVar3 = 0;
  do {
    lVar2 = uVar4 * 0x10;
    uVar1 = *(uint *)((cts->cb).fpr + uVar4 * 2 + -6);
    uVar6 = uVar1 >> 0x1c;
    if (uVar6 != 5) {
      if (uVar6 != 8) {
        if (uVar6 == 6) {
          CVar5 = 0xffffffff;
        }
        else {
          CVar5 = *(CTSize *)((long)(cts->cb).fpr + lVar2 + -0x2c);
        }
        uVar6 = 0;
        if ((uVar3 & 1) == 0) {
          uVar6 = uVar1 & 0xf0000;
        }
        *szp = CVar5;
        return uVar6 | uVar1 & 0xfff00000 | uVar3;
      }
      if ((uVar1 & 0x80ff0000) == 0x80020000) {
        if ((uVar3 & 1) == 0) {
          uVar3 = *(int *)((long)(cts->cb).fpr + lVar2 + -0x2c) << 0x10 | uVar3 | 1;
        }
      }
      else if ((uVar1 & 0x80ff0000) == 0x80010000) {
        uVar3 = uVar3 | *(uint *)((long)(cts->cb).fpr + lVar2 + -0x2c);
      }
    }
    uVar4 = (ulong)(uVar1 & 0xffff);
  } while( true );
}

Assistant:

CTInfo lj_ctype_info(CTState *cts, CTypeID id, CTSize *szp)
{
  CTInfo qual = 0;
  CType *ct = ctype_get(cts, id);
  for (;;) {
    CTInfo info = ct->info;
    if (ctype_isenum(info)) {
      /* Follow child. Need to look at its attributes, too. */
    } else if (ctype_isattrib(info)) {
      if (ctype_isxattrib(info, CTA_QUAL))
	qual |= ct->size;
      else if (ctype_isxattrib(info, CTA_ALIGN) && !(qual & CTFP_ALIGNED))
	qual |= CTFP_ALIGNED + CTALIGN(ct->size);
    } else {
      if (!(qual & CTFP_ALIGNED)) qual |= (info & CTF_ALIGN);
      qual |= (info & ~(CTF_ALIGN|CTMASK_CID));
      lua_assert(ctype_hassize(info) || ctype_isfunc(info));
      *szp = ctype_isfunc(info) ? CTSIZE_INVALID : ct->size;
      break;
    }
    ct = ctype_get(cts, ctype_cid(info));
  }
  return qual;
}